

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O3

agent_pending_query *
agent_query(strbuf *query,void **out,int *outlen,_func_void_void_ptr_void_ptr_int *callback,
           void *callback_ctx)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__s;
  size_t sVar5;
  ssize_t sVar6;
  agent_pending_query *paVar7;
  int *piVar9;
  int *extraout_RAX;
  int *piVar10;
  ulong uVar11;
  sockaddr_un addr;
  sockaddr local_9e [6];
  ulong uVar8;
  
  __s = getenv("SSH_AUTH_SOCK");
  if ((__s == (char *)0x0) || (sVar5 = strlen(__s), 0x6b < sVar5)) {
LAB_001164cd:
    *out = (void *)0x0;
    *outlen = 0;
    return (agent_pending_query *)0x0;
  }
  piVar10 = (int *)0x1;
  iVar2 = socket(1,1,0);
  if (-1 < iVar2) {
    cloexec(iVar2);
    local_9e[0].sa_family = 1;
    strcpy(local_9e[0].sa_data,__s);
    iVar3 = connect(iVar2,local_9e,0x6e);
    if (-1 < iVar3) {
      strbuf_finalise_agent_query(query);
      uVar8 = query->len;
      if (uVar8 != 0) {
        uVar11 = 0;
        do {
          sVar6 = write(iVar2,query->s + uVar11,uVar8 - uVar11);
          if ((int)sVar6 < 1) goto LAB_001164c6;
          uVar11 = (ulong)(uint)((int)uVar11 + (int)sVar6);
          uVar8 = query->len;
        } while (uVar11 < uVar8);
      }
      paVar7 = (agent_pending_query *)safemalloc(1,0x30,0);
      paVar7->fd = iVar2;
      paVar7->retbuf = paVar7->sizebuf;
      paVar7->retsize = 4;
      paVar7->retlen = 0;
      paVar7->callback = callback;
      paVar7->callback_ctx = callback_ctx;
      if (callback == (_func_void_void_ptr_void_ptr_int *)0x0) {
        no_nonblock(iVar2);
        do {
          _Var1 = agent_try_read(paVar7);
        } while (!_Var1);
        *out = paVar7->retbuf;
        *outlen = paVar7->retlen;
        safefree(paVar7);
        return (agent_pending_query *)0x0;
      }
      if (agent_pending_queries == (tree234 *)0x0) {
        agent_pending_queries = newtree234(agent_conncmp);
      }
      add234(agent_pending_queries,paVar7);
      uxsel_set(iVar2,1,agent_select_result);
      return paVar7;
    }
LAB_001164c6:
    close(iVar2);
    goto LAB_001164cd;
  }
  agent_query_cold_1();
  sVar6 = read(*piVar10,(void *)(*(long *)(piVar10 + 2) + (long)piVar10[6]),
               (long)piVar10[5] - (long)piVar10[6]);
  if ((int)sVar6 < 1) {
    piVar9 = piVar10 + 4;
    if (*(int **)(piVar10 + 2) != piVar9) {
      safefree(*(int **)(piVar10 + 2));
      piVar9 = extraout_RAX;
    }
LAB_001165a3:
    piVar10[2] = 0;
    piVar10[3] = 0;
    piVar10[6] = 0;
    paVar7 = (agent_pending_query *)CONCAT71((int7)((ulong)piVar9 >> 8),1);
  }
  else {
    uVar4 = (int)sVar6 + piVar10[6];
    uVar8 = (ulong)uVar4;
    piVar10[6] = uVar4;
    iVar2 = piVar10[5];
    if ((iVar2 == 4) && (uVar4 == 4)) {
      uVar4 = **(uint **)(piVar10 + 2);
      uVar4 = (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18) + 4;
      piVar9 = (int *)(ulong)uVar4;
      piVar10[5] = uVar4;
      if ((int)uVar4 < 1) goto LAB_001165a3;
      if (*(uint **)(piVar10 + 2) != (uint *)(piVar10 + 4)) {
        __assert_fail("conn->retbuf == conn->sizebuf",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                      ,0x52,"_Bool agent_try_read(agent_pending_query *)");
      }
      piVar9 = (int *)safemalloc((ulong)uVar4,1,0);
      *(int **)(piVar10 + 2) = piVar9;
      *piVar9 = piVar10[4];
      iVar2 = piVar10[5];
      uVar8 = (ulong)(uint)piVar10[6];
    }
    paVar7 = (agent_pending_query *)CONCAT71((int7)(uVar8 >> 8),iVar2 <= (int)uVar8);
  }
  return paVar7;
}

Assistant:

agent_pending_query *agent_query(
    strbuf *query, void **out, int *outlen,
    void (*callback)(void *, void *, int), void *callback_ctx)
{
    const char *name;
    int sock;
    struct sockaddr_un addr;
    int done;
    agent_pending_query *conn;

    name = agent_socket_path();
    if (!name || strlen(name) >= sizeof(addr.sun_path))
        goto failure;

    sock = socket(PF_UNIX, SOCK_STREAM, 0);
    if (sock < 0) {
        perror("socket(PF_UNIX)");
        exit(1);
    }

    cloexec(sock);

    addr.sun_family = AF_UNIX;
    strcpy(addr.sun_path, name);
    if (connect(sock, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
        close(sock);
        goto failure;
    }

    strbuf_finalise_agent_query(query);

    for (done = 0; done < query->len ;) {
        int ret = write(sock, query->s + done,
                        query->len - done);
        if (ret <= 0) {
            close(sock);
            goto failure;
        }
        done += ret;
    }

    conn = snew(agent_pending_query);
    conn->fd = sock;
    conn->retbuf = conn->sizebuf;
    conn->retsize = 4;
    conn->retlen = 0;
    conn->callback = callback;
    conn->callback_ctx = callback_ctx;

    if (!callback) {
        /*
         * Bodge to permit making deliberately synchronous agent
         * requests. Used by Unix Pageant in command-line client mode,
         * which is legit because it really is true that no other part
         * of the program is trying to get anything useful done
         * simultaneously. But this special case shouldn't be used in
         * any more general program.
         */
        no_nonblock(conn->fd);
        while (!agent_try_read(conn))
            /* empty loop body */;

        *out = conn->retbuf;
        *outlen = conn->retlen;
        sfree(conn);
        return NULL;
    }

    /*
     * Otherwise do it properly: add conn to the tree of agent
     * connections currently in flight, return 0 to indicate that the
     * response hasn't been received yet, and call the callback when
     * select_result comes back to us.
     */
    if (!agent_pending_queries)
        agent_pending_queries = newtree234(agent_conncmp);
    add234(agent_pending_queries, conn);

    uxsel_set(sock, SELECT_R, agent_select_result);
    return conn;

    failure:
    *out = NULL;
    *outlen = 0;
    return NULL;
}